

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_TxPDO(ecx_contextt *context,uint16 slave,uint16 TxPDOnumber,int *psize,void *p,int timeout)

{
  uint8 uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  uint16 ErrorCode;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  int local_838;
  byte local_833;
  ushort local_832;
  undefined1 local_830 [1016];
  uint8 local_438 [5];
  byte local_433;
  ushort local_432;
  
  ec_clearmbx((ec_mbxbuft *)&local_838);
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_838,0);
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_438[0] = '\x02';
  local_438[1] = '\0';
  local_438[2] = '\0';
  local_438[3] = '\0';
  local_438[4] = '\0';
  uVar3 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar1 = ec_nextmbxcnt(context->slavelist[uVar3].mbx_cnt);
  context->slavelist[uVar3].mbx_cnt = uVar1;
  local_433 = uVar1 << 4 | 3;
  local_432 = TxPDOnumber & 0x1ff | 0x6000;
  iVar2 = ecx_mbxsend(context,slave,(ec_mbxbuft *)local_438,20000);
  if (0 < iVar2) {
    ec_clearmbx((ec_mbxbuft *)&local_838);
    iVar2 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_838,timeout);
    if (0 < iVar2) {
      if (((local_833 & 0xf) == 3) && ((local_832 & 0xf000) == 0x4000)) {
        uVar4 = local_838 - 2U & 0xffff;
        if ((int)uVar4 <= *psize) {
          memcpy(p,local_830,(ulong)uVar4);
          *psize = uVar4;
          return iVar2;
        }
        ErrorCode = 3;
      }
      else {
        ErrorCode = 1;
      }
      iVar2 = 0;
      ecx_packeterror(context,slave,0,'\0',ErrorCode);
    }
  }
  return iVar2;
}

Assistant:

int ecx_TxPDO(ecx_contextt *context, uint16 slave, uint16 TxPDOnumber , int *psize, void *p, int timeout)
{
   ec_SDOt *SDOp, *aSDOp;
   int wkc;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   uint16 framedatasize;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOt *)&MbxIn;
   SDOp = (ec_SDOt *)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x02);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* get new mailbox counter, used for session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes((TxPDOnumber & 0x01ff) + (ECT_COES_TXPDO_RR << 12)); /* number 9bits service upper 4 bits */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0)
   {
      /* clean mailboxbuffer */
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
      if (wkc > 0) /* succeeded to read slave response ? */
      {
         /* slave response should be CoE, TxPDO */
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_TXPDO))
         {
            /* TxPDO response */
            framedatasize = (aSDOp->MbxHeader.length - 2);
            if (*psize >= framedatasize) /* parameter buffer big enough ? */
            {
               /* copy parameter in parameter buffer */
               memcpy(p, &aSDOp->Command, framedatasize);
               /* return the real parameter size */
               *psize = framedatasize;
            }
            /* parameter buffer too small */
            else
            {
               wkc = 0;
               ecx_packeterror(context, slave, 0, 0, 3); /*  data container too small for type */
            }
         }   
         /* other slave response */
         else
         {
            if ((aSDOp->Command) == ECT_SDO_ABORT) /* SDO abort frame received */
            {
               ecx_SDOerror(context, slave, 0, 0, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, slave, 0, 0, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }         
   }

   return wkc;
}